

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_vui_parameters(sps_t *sps,bs_t *b)

{
  byte bVar1;
  uint32_t r;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  uVar9 = b->bits_left - 1;
  b->bits_left = uVar9;
  pbVar7 = b->p;
  pbVar8 = b->end;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      b->bits_left = 8;
      (sps->vui).aspect_ratio_info_present_flag = uVar2;
      uVar9 = 8;
      if (uVar2 != 0) {
LAB_00124f64:
        uVar9 = 8;
        if (pbVar8 <= pbVar7) goto LAB_00124f7a;
        uVar2 = (uint)*pbVar7;
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        goto LAB_00124fc4;
      }
    }
    else {
      (sps->vui).aspect_ratio_info_present_flag = uVar2;
      if (uVar2 != 0) {
        if (uVar9 == 8) goto LAB_00124f64;
LAB_00124f7a:
        uVar2 = 0;
        iVar4 = 7;
        do {
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          uVar3 = 0;
          if (pbVar7 < pbVar8) {
            uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
          }
          if (uVar9 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
LAB_00124fc4:
        (sps->vui).aspect_ratio_idc = uVar2;
        if (uVar2 == 0xff) {
          uVar2 = 0;
          iVar4 = 0xf;
          do {
            uVar9 = uVar9 - 1;
            b->bits_left = uVar9;
            uVar3 = 0;
            if (pbVar7 < pbVar8) {
              uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
            }
            if (uVar9 == 0) {
              pbVar7 = pbVar7 + 1;
              b->p = pbVar7;
              b->bits_left = 8;
              uVar9 = 8;
            }
            uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
            bVar12 = iVar4 != 0;
            iVar4 = iVar4 + -1;
          } while (bVar12);
          (sps->vui).sar_width = uVar2;
          uVar2 = 0;
          iVar4 = 0xf;
          do {
            uVar9 = uVar9 - 1;
            b->bits_left = uVar9;
            uVar3 = 0;
            if (pbVar7 < pbVar8) {
              uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
            }
            if (uVar9 == 0) {
              pbVar7 = pbVar7 + 1;
              b->p = pbVar7;
              b->bits_left = 8;
              uVar9 = 8;
            }
            uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
            bVar12 = iVar4 != 0;
            iVar4 = iVar4 + -1;
          } while (bVar12);
          lVar6 = 0xc7c;
          goto LAB_00125074;
        }
      }
    }
  }
  else {
    lVar6 = 0xc70;
    uVar2 = 0;
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      uVar9 = 8;
      uVar2 = 0;
    }
LAB_00125074:
    *(uint *)((long)sps->seq_scaling_list_present_flag + lVar6 + -0x40) = uVar2;
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).overscan_info_present_flag = uVar2;
  if (uVar2 != 0) {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar2 = 0;
    if (pbVar7 < pbVar8) {
      uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      uVar9 = 8;
    }
    (sps->vui).overscan_appropriate_flag = uVar2;
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).video_signal_type_present_flag = uVar2;
  if (uVar2 == 0) goto LAB_00125344;
  uVar2 = 0;
  iVar4 = 2;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar3 = 0;
    if (pbVar7 < pbVar8) {
      uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
    bVar12 = iVar4 != 0;
    iVar4 = iVar4 + -1;
  } while (bVar12);
  (sps->vui).video_format = uVar2;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).video_full_range_flag = uVar2;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      b->bits_left = 8;
      (sps->vui).colour_description_present_flag = uVar2;
      uVar9 = 8;
      if (uVar2 != 0) {
LAB_001251f0:
        uVar9 = 8;
        if (pbVar8 <= pbVar7) goto LAB_0012520c;
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        (sps->vui).colour_primaries = (uint)bVar1;
LAB_00125261:
        uVar9 = 8;
        if (pbVar8 <= pbVar7) goto LAB_0012527d;
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        (sps->vui).transfer_characteristics = (uint)bVar1;
LAB_001252d2:
        uVar9 = 8;
        if (pbVar7 < pbVar8) {
          uVar2 = (uint)*pbVar7;
          lVar6 = 0xca0;
          goto LAB_001252e4;
        }
        goto LAB_001252f2;
      }
    }
    else {
      (sps->vui).colour_description_present_flag = uVar2;
      if (uVar2 != 0) {
        if (uVar9 == 8) goto LAB_001251f0;
LAB_0012520c:
        uVar2 = 0;
        iVar4 = 7;
        do {
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          uVar3 = 0;
          if (pbVar7 < pbVar8) {
            uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
          }
          if (uVar9 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
        (sps->vui).colour_primaries = uVar2;
        if (uVar9 == 8) goto LAB_00125261;
LAB_0012527d:
        uVar2 = 0;
        iVar4 = 7;
        do {
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          uVar3 = 0;
          if (pbVar7 < pbVar8) {
            uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
          }
          if (uVar9 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
        (sps->vui).transfer_characteristics = uVar2;
        if (uVar9 == 8) goto LAB_001252d2;
LAB_001252f2:
        uVar2 = 0;
        iVar4 = 7;
        do {
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          uVar3 = 0;
          if (pbVar7 < pbVar8) {
            uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
          }
          if (uVar9 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
        lVar6 = 0xca0;
        goto LAB_00125341;
      }
    }
  }
  else {
    uVar2 = 0;
    lVar6 = 0xc94;
    if (uVar9 == 0) {
LAB_001252e4:
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      uVar9 = 8;
    }
LAB_00125341:
    *(uint *)((long)sps->seq_scaling_list_present_flag + lVar6 + -0x40) = uVar2;
  }
LAB_00125344:
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).chroma_loc_info_present_flag = uVar2;
  if (uVar2 != 0) {
    uVar2 = 0xffffffff;
    iVar4 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar12 & uVar2 < 0x20)) && (pbVar7 < pbVar8));
    iVar10 = 0;
    if (iVar4 == -1) {
      uVar2 = 0;
    }
    else {
      iVar5 = -2 - iVar4;
      iVar11 = -3 - iVar4;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar5 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar11 != -2);
    }
    uVar3 = 0xffffffff;
    (sps->vui).chroma_sample_loc_type_top_field = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar2;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar12 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
    if (iVar10 == -1) {
      uVar2 = 0;
    }
    else {
      iVar4 = -2 - iVar10;
      iVar5 = -3 - iVar10;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
        iVar5 = iVar5 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar5 != -2);
    }
    (sps->vui).chroma_sample_loc_type_bottom_field = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar2;
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).timing_info_present_flag = uVar2;
  if (uVar2 != 0) {
    uVar2 = 0;
    iVar4 = 0x1f;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar7 < pbVar8) {
        uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
      bVar12 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar12);
    (sps->vui).num_units_in_tick = uVar2;
    uVar2 = 0;
    iVar4 = 0x1f;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar7 < pbVar8) {
        uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
      bVar12 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar12);
    (sps->vui).time_scale = uVar2;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar2 = 0;
    if (pbVar7 < pbVar8) {
      uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      uVar9 = 8;
    }
    (sps->vui).fixed_frame_rate_flag = uVar2;
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    b->bits_left = 8;
    uVar9 = 8;
  }
  (sps->vui).nal_hrd_parameters_present_flag = uVar2;
  if (uVar2 != 0) {
    read_hrd_parameters(&sps->hrd_nal,b);
    uVar9 = b->bits_left;
    pbVar7 = b->p;
    pbVar8 = b->end;
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    b->p = pbVar7 + 1;
    b->bits_left = 8;
  }
  (sps->vui).vcl_hrd_parameters_present_flag = uVar2;
  if (uVar2 != 0) {
    read_hrd_parameters(&sps->hrd_vcl,b);
  }
  if ((sps->vui).nal_hrd_parameters_present_flag == 0) {
    uVar9 = b->bits_left;
    pbVar7 = b->p;
    pbVar8 = b->end;
    if ((sps->vui).vcl_hrd_parameters_present_flag == 0) goto LAB_00125717;
  }
  else {
    uVar9 = b->bits_left;
    pbVar7 = b->p;
    pbVar8 = b->end;
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).low_delay_hrd_flag = uVar2;
LAB_00125717:
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar9 = 8;
  }
  (sps->vui).pic_struct_present_flag = uVar2;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  uVar2 = 0;
  if (pbVar7 < pbVar8) {
    uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    b->bits_left = 8;
    uVar9 = 8;
  }
  (sps->vui).bitstream_restriction_flag = uVar2;
  if (uVar2 != 0) {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar2 = 0;
    if (pbVar7 < pbVar8) {
      uVar2 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      uVar9 = 8;
    }
    (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar2;
    uVar2 = 0xffffffff;
    iVar4 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar12 & uVar2 < 0x20)) && (pbVar7 < pbVar8));
    iVar10 = 0;
    if (iVar4 == -1) {
      uVar2 = 0;
    }
    else {
      iVar5 = -2 - iVar4;
      iVar11 = -3 - iVar4;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar5 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar11 != -2);
    }
    uVar3 = 0xffffffff;
    (sps->vui).max_bytes_per_pic_denom = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar2;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar12 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
    iVar4 = 0;
    if (iVar10 == -1) {
      uVar2 = 0;
    }
    else {
      iVar5 = -2 - iVar10;
      iVar11 = -3 - iVar10;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar5 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar11 != -2);
    }
    uVar3 = 0xffffffff;
    (sps->vui).max_bits_per_mb_denom = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar2;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar12 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
    iVar10 = 0;
    if (iVar4 == -1) {
      uVar2 = 0;
    }
    else {
      iVar5 = -2 - iVar4;
      iVar11 = -3 - iVar4;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar5 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar11 != -2);
    }
    uVar3 = 0xffffffff;
    (sps->vui).log2_max_mv_length_horizontal = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar2;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar12 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
    iVar4 = 0;
    if (iVar10 == -1) {
      uVar2 = 0;
    }
    else {
      iVar5 = -2 - iVar10;
      iVar11 = -3 - iVar10;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar5 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar11 != -2);
    }
    uVar3 = 0xffffffff;
    (sps->vui).log2_max_mv_length_vertical = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar2;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar12 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
    iVar10 = 0;
    if (iVar4 == -1) {
      uVar2 = 0;
    }
    else {
      iVar5 = -2 - iVar4;
      iVar11 = -3 - iVar4;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar5 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar11 != -2);
    }
    uVar3 = 0xffffffff;
    (sps->vui).num_reorder_frames = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar2;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar12 = true;
      if (pbVar7 < pbVar8) {
        bVar12 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar12 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
    if (iVar10 == -1) {
      uVar2 = 0;
    }
    else {
      iVar4 = -2 - iVar10;
      iVar5 = -3 - iVar10;
      uVar2 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar7 < pbVar8) {
          uVar3 = (uint)((*pbVar7 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
        iVar5 = iVar5 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar5 != -2);
    }
    (sps->vui).max_dec_frame_buffering = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar2;
  }
  return;
}

Assistant:

void read_vui_parameters(sps_t* sps, bs_t* b)
{
    sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b);
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        sps->vui.aspect_ratio_idc = bs_read_u8(b);
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            sps->vui.sar_width = bs_read_u(b, 16);
            sps->vui.sar_height = bs_read_u(b, 16);
        }
    }
    sps->vui.overscan_info_present_flag = bs_read_u1(b);
    if( sps->vui.overscan_info_present_flag )
    {
        sps->vui.overscan_appropriate_flag = bs_read_u1(b);
    }
    sps->vui.video_signal_type_present_flag = bs_read_u1(b);
    if( sps->vui.video_signal_type_present_flag )
    {
        sps->vui.video_format = bs_read_u(b, 3);
        sps->vui.video_full_range_flag = bs_read_u1(b);
        sps->vui.colour_description_present_flag = bs_read_u1(b);
        if( sps->vui.colour_description_present_flag )
        {
            sps->vui.colour_primaries = bs_read_u8(b);
            sps->vui.transfer_characteristics = bs_read_u8(b);
            sps->vui.matrix_coefficients = bs_read_u8(b);
        }
    }
    sps->vui.chroma_loc_info_present_flag = bs_read_u1(b);
    if( sps->vui.chroma_loc_info_present_flag )
    {
        sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b);
        sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b);
    }
    sps->vui.timing_info_present_flag = bs_read_u1(b);
    if( sps->vui.timing_info_present_flag )
    {
        sps->vui.num_units_in_tick = bs_read_u(b, 32);
        sps->vui.time_scale = bs_read_u(b, 32);
        sps->vui.fixed_frame_rate_flag = bs_read_u1(b);
    }
    sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b);
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_hrd_parameters(&sps->hrd_nal, b);
    }
    sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b);
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        sps->vui.low_delay_hrd_flag = bs_read_u1(b);
    }
    sps->vui.pic_struct_present_flag = bs_read_u1(b);
    sps->vui.bitstream_restriction_flag = bs_read_u1(b);
    if( sps->vui.bitstream_restriction_flag )
    {
        sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b);
        sps->vui.max_bytes_per_pic_denom = bs_read_ue(b);
        sps->vui.max_bits_per_mb_denom = bs_read_ue(b);
        sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b);
        sps->vui.log2_max_mv_length_vertical = bs_read_ue(b);
        sps->vui.num_reorder_frames = bs_read_ue(b);
        sps->vui.max_dec_frame_buffering = bs_read_ue(b);
    }
}